

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

string * __thiscall pbrt::RGB::ToString_abi_cxx11_(string *__return_storage_ptr__,RGB *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ %f %f %f ]",&this->r,&this->g,&this->b);
  return __return_storage_ptr__;
}

Assistant:

std::string RGB::ToString() const {
    return StringPrintf("[ %f %f %f ]", r, g, b);
}